

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O2

value_t __thiscall
directed_flag_complex_computer::directed_flag_complex_computer_t::filtration
          (directed_flag_complex_computer_t *this,int dimension,index_t index)

{
  long lVar1;
  vector<float,_std::allocator<float>_> *pvVar2;
  
  if (this->filtration_algorithm == (filtration_algorithm_t *)0x0) {
    return 0.0;
  }
  if (dimension == 1) {
    lVar1 = 0xc0;
  }
  else {
    if (dimension != 0) {
      pvVar2 = &this->next_filtration;
      goto LAB_0014994c;
    }
    lVar1 = 0xa8;
  }
  pvVar2 = (vector<float,_std::allocator<float>_> *)
           ((long)&(this->graph->super_directed_graph_t).number_of_vertices + lVar1);
LAB_0014994c:
  return (pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
         ._M_start[index];
}

Assistant:

inline value_t filtration(int dimension, index_t index) const {
		// Only return something if we have a non-trivial filtration algorithm
		if (filtration_algorithm == nullptr) return 0.0f;

		if (dimension == 0) return graph.vertex_filtration[index];

		assert(dimension == current_dimension + 1);
		if (dimension == 1) return graph.edge_filtration[index];

		return next_filtration[index];
	}